

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Ses_Man_t *pSes;
  char *pcVar6;
  Abc_Ntk_t *pAVar7;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  abctime aVar12;
  int iVar13;
  undefined4 in_register_0000008c;
  byte *pbVar14;
  byte local_65;
  byte local_64;
  byte local_63;
  undefined2 local_62;
  Vec_Ptr_t *local_60;
  Abc_Ntk_t *local_58;
  Vec_Ptr_t *local_50;
  char *local_48;
  Ses_Man_t *local_40;
  abctime local_38;
  
  local_60 = (Vec_Ptr_t *)CONCAT44(in_register_0000008c,nBTLimit);
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x976,"Abc_Ntk_t *Abc_NtkFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  local_38 = Abc_Clock();
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,0,(int)local_60,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 0;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  pcVar6 = Ses_ManFindMinimumSize(pSes);
  iVar13 = 0;
  if (pcVar6 == (char *)0x0) {
    pAVar7 = (Abc_Ntk_t *)0x0;
  }
  else {
    pAVar7 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
    pcVar8 = Extra_UtilStrsav("exact");
    pAVar7->pName = pcVar8;
    local_60 = Vec_PtrAlloc((int)pcVar6[2] + (int)*pcVar6);
    local_62 = 0x30;
    pVVar9 = Abc_NodeGetFakeNames((int)pcVar6[1] + (int)*pcVar6);
    Vec_PtrPush(pAVar7->vObjs,(void *)0x0);
    for (; iVar13 < *pcVar6; iVar13 = iVar13 + 1) {
      pAVar10 = Abc_NtkCreatePi(pAVar7);
      pcVar8 = (char *)Vec_PtrEntry(pVVar9,iVar13);
      Abc_ObjAssignName(pAVar10,pcVar8,(char *)0x0);
      Vec_PtrPush(local_60,pAVar10);
    }
    pbVar14 = (byte *)(pcVar6 + 3);
    local_58 = pAVar7;
    local_50 = pVVar9;
    local_48 = pcVar6;
    for (iVar13 = 0; pAVar7 = local_58, iVar13 < local_48[2]; iVar13 = iVar13 + 1) {
      bVar2 = *pbVar14;
      local_63 = bVar2 & 1 | 0x30;
      local_64 = bVar2 >> 1 & 1 | 0x30;
      local_65 = bVar2 >> 2 & 1 | 0x30;
      if (pbVar14[1] != 2) {
        __assert_fail("*p == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0x700,"Abc_Ntk_t *Ses_ManExtractNtk(const char *)");
      }
      pcVar6 = Abc_SopFromTruthBin((char *)&local_65);
      pAVar7 = local_58;
      pAVar10 = Abc_NtkCreateNode(local_58);
      pcVar8 = Abc_SopRegister((Mem_Flex_t *)pAVar7->pManFunc,pcVar6);
      pVVar9 = local_60;
      (pAVar10->field_5).pData = pcVar8;
      Vec_PtrPush(local_60,pAVar10);
      free(pcVar6);
      pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,(int)(char)pbVar14[2]);
      Abc_ObjAddFanin(pAVar10,pAVar11);
      pbVar1 = pbVar14 + 3;
      pbVar14 = pbVar14 + 4;
      pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,(int)(char)*pbVar1);
      Abc_ObjAddFanin(pAVar10,pAVar11);
    }
    local_40 = pSes;
    for (iVar13 = 0; pcVar6 = local_48, iVar13 < local_48[1]; iVar13 = iVar13 + 1) {
      pAVar10 = Abc_NtkCreateObj(pAVar7,ABC_OBJ_PO);
      pcVar8 = (char *)Vec_PtrEntry(local_50,*pcVar6 + iVar13);
      Abc_ObjAssignName(pAVar10,pcVar8,(char *)0x0);
      iVar4 = Abc_LitIsCompl((int)(char)*pbVar14);
      cVar3 = *pcVar6;
      iVar5 = Abc_Lit2Var((int)(char)*pbVar14);
      pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(local_60,cVar3 + iVar5);
      if (iVar4 != 0) {
        pAVar11 = Abc_NtkCreateNodeInv(pAVar7,pAVar11);
      }
      Abc_ObjAddFanin(pAVar10,pAVar11);
      pbVar14 = pbVar14 + (long)*local_48 + 2;
    }
    Abc_NodeFreeNames(local_50);
    Vec_PtrFree(local_60);
    iVar13 = Abc_NtkCheck(pAVar7);
    if (iVar13 == 0) {
      puts("Ses_ManExtractSolution(): Network check has failed.");
    }
    free(pcVar6);
    pSes = local_40;
  }
  aVar12 = Abc_Clock();
  pSes->timeTotal = aVar12 - local_38;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  Ses_ManClean(pSes);
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_NtkFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Abc_Ntk_t * pNtk = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 0, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fReasonVerbose = 0;
    pSes->fSatVerbose = 0;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pNtk = Ses_ManExtractNtk( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pNtk;
}